

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlfield.cpp
# Opt level: O0

void __thiscall QSqlField::setDefaultValue(QSqlField *this,QVariant *value)

{
  QSqlFieldPrivate *pQVar1;
  QVariant *in_RSI;
  
  detach((QSqlField *)0x133111);
  pQVar1 = QExplicitlySharedDataPointer<QSqlFieldPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QSqlFieldPrivate> *)0x133129);
  QVariant::operator=(&pQVar1->def,in_RSI);
  return;
}

Assistant:

void QSqlField::setDefaultValue(const QVariant &value)
{
    detach();
    d->def = value;
}